

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O2

void __thiscall CcsTest_Escapes_Test::CcsTest_Escapes_Test(CcsTest_Escapes_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00196158;
  return;
}

Assistant:

TEST(CcsTest, Escapes) {
  CcsDomain ccs;
  std::istringstream input(
      "a = '\\\"\\t\\n\\'s'; b = '\\\\'; c = 'Hi \\\nthere'");
  ccs.loadCcsStream(input, "<literal>", ImportResolver::None);
  CcsContext ctx = ccs.build();
  EXPECT_EQ("\"\t\n's", ctx.getString("a"));
  EXPECT_EQ("\\", ctx.getString("b"));
  EXPECT_EQ("Hi there", ctx.getString("c"));
}